

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O1

void __thiscall choc::value::Value::Value(Value *this,ValueView *source)

{
  MainType MVar1;
  uint32_t uVar2;
  uint8_t *source_00;
  bool bVar3;
  size_t size;
  StringDictionary *local_20;
  
  source_00 = source->data;
  MVar1 = (source->type).mainType;
  size = 4;
  if (MVar1 < string) {
    switch(MVar1) {
    case void_:
      size = 0;
      break;
    case boolean:
      size = 1;
      break;
    case ~(complexArray|primitiveArray|vector|int64|int32|boolean):
    case ~(complexArray|primitiveArray|vector|int64|int32):
    case int32|boolean:
    case ~(complexArray|primitiveArray|vector|int64|boolean):
    case ~(complexArray|primitiveArray|vector|int64):
switchD_001c1f1f_caseD_2:
      throwError("Invalid type");
    case int32:
      break;
    default:
      if (MVar1 == float32) break;
      if (MVar1 != float64) goto switchD_001c1f1f_caseD_2;
    case int64:
      size = 8;
    }
  }
  else if (MVar1 < primitiveArray) {
    if (MVar1 != string) {
      if (MVar1 != vector) goto switchD_001c1f1f_caseD_2;
      size = (ulong)(source->type).content.vector.numElements *
             (ulong)((source->type).content.vector.elementType & 0xf);
    }
  }
  else if (MVar1 == primitiveArray) {
    uVar2 = (source->type).content.primitiveArray.numVectorElements;
    size = (ulong)(source->type).content.vector.numElements *
           (ulong)((uVar2 + (uVar2 == 0)) * ((source->type).content.vector.elementType & 0xf));
  }
  else if (MVar1 == complexArray) {
    size = Type::ComplexArray::getValueDataSize((source->type).content.complexArray);
  }
  else {
    if (MVar1 != object) goto switchD_001c1f1f_caseD_2;
    size = Type::Object::getValueDataSize((source->type).content.object);
  }
  Value(this,&source->type,source_00,size);
  if (source->stringDictionary != (StringDictionary *)0x0) {
    MVar1 = (this->value).type.mainType;
    if ((MVar1 == string) ||
       ((MVar1 == object &&
        (bVar3 = Type::Object::usesStrings((this->value).type.content.object), bVar3)))) {
      local_20 = source->stringDictionary;
      importStringHandles(choc::value::ValueView&,choc::value::StringDictionary_const&)::
      StringHandleImporter::importStrings(choc::value::ValueView__(&local_20,&this->value);
    }
  }
  return;
}

Assistant:

inline Value::Value (const ValueView& source) : Value (source.type, source.getRawData(), source.type.getValueDataSize())
{
    if (source.stringDictionary != nullptr && value.type.usesStrings())
        importStringHandles (value, *source.stringDictionary);
}